

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inter_pred_avx2.c
# Opt level: O0

void uavs3d_if_hor_luma_w32x_avx2
               (pel *src,int i_src,pel *dst,int i_dst,int width,int height,s8 *coeff,int max_val)

{
  undefined8 *puVar1;
  ushort uVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  int in_ECX;
  undefined1 in_DL;
  undefined7 in_register_00000011;
  int in_ESI;
  undefined1 in_DIL;
  undefined7 in_register_00000039;
  int in_R8D;
  int in_R9D;
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  ushort *in_stack_00000008;
  __m256i mCoefy4_hor;
  __m256i mCoefy3_hor;
  __m256i mCoefy2_hor;
  __m256i mCoefy1_hor;
  __m256i r3;
  __m256i r2;
  __m256i r1;
  __m256i r0;
  __m256i T3;
  __m256i T2;
  __m256i sum1;
  __m256i sum0;
  __m256i S3;
  __m256i S2;
  __m256i S1;
  __m256i S0;
  __m256i T1;
  __m256i T0;
  __m256i mSwitch4;
  __m256i mSwitch3;
  __m256i mSwitch2;
  __m256i mSwitch1;
  __m256i mAddOffset;
  int shift;
  int offset;
  int col;
  undefined1 auStack_c30 [16];
  int local_aa8;
  int local_aa4;
  long local_a98;
  long local_a88;
  undefined1 local_340 [16];
  undefined8 local_2e0;
  undefined8 uStack_2d8;
  undefined8 local_2c0;
  undefined8 uStack_2b8;
  undefined8 uStack_290;
  undefined8 uStack_288;
  undefined8 uStack_250;
  undefined8 uStack_248;
  undefined8 uStack_210;
  undefined8 uStack_208;
  undefined8 uStack_1d0;
  undefined8 uStack_1c8;
  undefined8 uStack_190;
  undefined8 uStack_188;
  undefined8 uStack_150;
  undefined8 uStack_148;
  undefined8 uStack_110;
  undefined8 uStack_108;
  undefined8 uStack_d0;
  undefined8 uStack_c8;
  undefined8 uStack_90;
  undefined8 uStack_88;
  
  local_a98 = CONCAT71(in_register_00000011,in_DL);
  auVar7 = vpinsrw_avx(ZEXT216(0x20),0x20,1);
  auVar7 = vpinsrw_avx(auVar7,0x20,2);
  auVar7 = vpinsrw_avx(auVar7,0x20,3);
  auVar7 = vpinsrw_avx(auVar7,0x20,4);
  auVar7 = vpinsrw_avx(auVar7,0x20,5);
  auVar7 = vpinsrw_avx(auVar7,0x20,6);
  auVar8 = vpinsrw_avx(auVar7,0x20,7);
  auVar7 = vpinsrw_avx(ZEXT216(0x20),0x20,1);
  auVar7 = vpinsrw_avx(auVar7,0x20,2);
  auVar7 = vpinsrw_avx(auVar7,0x20,3);
  auVar7 = vpinsrw_avx(auVar7,0x20,4);
  auVar7 = vpinsrw_avx(auVar7,0x20,5);
  auVar7 = vpinsrw_avx(auVar7,0x20,6);
  auVar7 = vpinsrw_avx(auVar7,0x20,7);
  uStack_290 = auVar7._0_8_;
  uStack_288 = auVar7._8_8_;
  auVar7 = vpinsrb_avx(ZEXT116(0),1,1);
  auVar7 = vpinsrb_avx(auVar7,1,2);
  auVar7 = vpinsrb_avx(auVar7,2,3);
  auVar7 = vpinsrb_avx(auVar7,2,4);
  auVar7 = vpinsrb_avx(auVar7,3,5);
  auVar7 = vpinsrb_avx(auVar7,3,6);
  auVar7 = vpinsrb_avx(auVar7,4,7);
  auVar7 = vpinsrb_avx(auVar7,4,8);
  auVar7 = vpinsrb_avx(auVar7,5,9);
  auVar7 = vpinsrb_avx(auVar7,5,10);
  auVar7 = vpinsrb_avx(auVar7,6,0xb);
  auVar7 = vpinsrb_avx(auVar7,6,0xc);
  auVar7 = vpinsrb_avx(auVar7,7,0xd);
  auVar7 = vpinsrb_avx(auVar7,7,0xe);
  auVar7 = vpinsrb_avx(auVar7,8,0xf);
  auVar3 = vpinsrb_avx(ZEXT116(0),1,1);
  auVar3 = vpinsrb_avx(auVar3,1,2);
  auVar3 = vpinsrb_avx(auVar3,2,3);
  auVar3 = vpinsrb_avx(auVar3,2,4);
  auVar3 = vpinsrb_avx(auVar3,3,5);
  auVar3 = vpinsrb_avx(auVar3,3,6);
  auVar3 = vpinsrb_avx(auVar3,4,7);
  auVar3 = vpinsrb_avx(auVar3,4,8);
  auVar3 = vpinsrb_avx(auVar3,5,9);
  auVar3 = vpinsrb_avx(auVar3,5,10);
  auVar3 = vpinsrb_avx(auVar3,6,0xb);
  auVar3 = vpinsrb_avx(auVar3,6,0xc);
  auVar3 = vpinsrb_avx(auVar3,7,0xd);
  auVar3 = vpinsrb_avx(auVar3,7,0xe);
  auVar3 = vpinsrb_avx(auVar3,8,0xf);
  uStack_150 = auVar3._0_8_;
  uStack_148 = auVar3._8_8_;
  auVar3 = vpinsrb_avx(ZEXT116(2),3,1);
  auVar3 = vpinsrb_avx(auVar3,3,2);
  auVar3 = vpinsrb_avx(auVar3,4,3);
  auVar3 = vpinsrb_avx(auVar3,4,4);
  auVar3 = vpinsrb_avx(auVar3,5,5);
  auVar3 = vpinsrb_avx(auVar3,5,6);
  auVar3 = vpinsrb_avx(auVar3,6,7);
  auVar3 = vpinsrb_avx(auVar3,6,8);
  auVar3 = vpinsrb_avx(auVar3,7,9);
  auVar3 = vpinsrb_avx(auVar3,7,10);
  auVar3 = vpinsrb_avx(auVar3,8,0xb);
  auVar3 = vpinsrb_avx(auVar3,8,0xc);
  auVar3 = vpinsrb_avx(auVar3,9,0xd);
  auVar3 = vpinsrb_avx(auVar3,9,0xe);
  auVar3 = vpinsrb_avx(auVar3,10,0xf);
  auVar4 = vpinsrb_avx(ZEXT116(2),3,1);
  auVar4 = vpinsrb_avx(auVar4,3,2);
  auVar4 = vpinsrb_avx(auVar4,4,3);
  auVar4 = vpinsrb_avx(auVar4,4,4);
  auVar4 = vpinsrb_avx(auVar4,5,5);
  auVar4 = vpinsrb_avx(auVar4,5,6);
  auVar4 = vpinsrb_avx(auVar4,6,7);
  auVar4 = vpinsrb_avx(auVar4,6,8);
  auVar4 = vpinsrb_avx(auVar4,7,9);
  auVar4 = vpinsrb_avx(auVar4,7,10);
  auVar4 = vpinsrb_avx(auVar4,8,0xb);
  auVar4 = vpinsrb_avx(auVar4,8,0xc);
  auVar4 = vpinsrb_avx(auVar4,9,0xd);
  auVar4 = vpinsrb_avx(auVar4,9,0xe);
  auVar4 = vpinsrb_avx(auVar4,10,0xf);
  uStack_110 = auVar4._0_8_;
  uStack_108 = auVar4._8_8_;
  auVar4 = vpinsrb_avx(ZEXT116(4),5,1);
  auVar4 = vpinsrb_avx(auVar4,5,2);
  auVar4 = vpinsrb_avx(auVar4,6,3);
  auVar4 = vpinsrb_avx(auVar4,6,4);
  auVar4 = vpinsrb_avx(auVar4,7,5);
  auVar4 = vpinsrb_avx(auVar4,7,6);
  auVar4 = vpinsrb_avx(auVar4,8,7);
  auVar4 = vpinsrb_avx(auVar4,8,8);
  auVar4 = vpinsrb_avx(auVar4,9,9);
  auVar4 = vpinsrb_avx(auVar4,9,10);
  auVar4 = vpinsrb_avx(auVar4,10,0xb);
  auVar4 = vpinsrb_avx(auVar4,10,0xc);
  auVar4 = vpinsrb_avx(auVar4,0xb,0xd);
  auVar4 = vpinsrb_avx(auVar4,0xb,0xe);
  auVar4 = vpinsrb_avx(auVar4,0xc,0xf);
  auVar5 = vpinsrb_avx(ZEXT116(4),5,1);
  auVar5 = vpinsrb_avx(auVar5,5,2);
  auVar5 = vpinsrb_avx(auVar5,6,3);
  auVar5 = vpinsrb_avx(auVar5,6,4);
  auVar5 = vpinsrb_avx(auVar5,7,5);
  auVar5 = vpinsrb_avx(auVar5,7,6);
  auVar5 = vpinsrb_avx(auVar5,8,7);
  auVar5 = vpinsrb_avx(auVar5,8,8);
  auVar5 = vpinsrb_avx(auVar5,9,9);
  auVar5 = vpinsrb_avx(auVar5,9,10);
  auVar5 = vpinsrb_avx(auVar5,10,0xb);
  auVar5 = vpinsrb_avx(auVar5,10,0xc);
  auVar5 = vpinsrb_avx(auVar5,0xb,0xd);
  auVar5 = vpinsrb_avx(auVar5,0xb,0xe);
  auVar5 = vpinsrb_avx(auVar5,0xc,0xf);
  uStack_d0 = auVar5._0_8_;
  uStack_c8 = auVar5._8_8_;
  auVar5 = vpinsrb_avx(ZEXT116(6),7,1);
  auVar5 = vpinsrb_avx(auVar5,7,2);
  auVar5 = vpinsrb_avx(auVar5,8,3);
  auVar5 = vpinsrb_avx(auVar5,8,4);
  auVar5 = vpinsrb_avx(auVar5,9,5);
  auVar5 = vpinsrb_avx(auVar5,9,6);
  auVar5 = vpinsrb_avx(auVar5,10,7);
  auVar5 = vpinsrb_avx(auVar5,10,8);
  auVar5 = vpinsrb_avx(auVar5,0xb,9);
  auVar5 = vpinsrb_avx(auVar5,0xb,10);
  auVar5 = vpinsrb_avx(auVar5,0xc,0xb);
  auVar5 = vpinsrb_avx(auVar5,0xc,0xc);
  auVar5 = vpinsrb_avx(auVar5,0xd,0xd);
  auVar5 = vpinsrb_avx(auVar5,0xd,0xe);
  auVar5 = vpinsrb_avx(auVar5,0xe,0xf);
  auVar6 = vpinsrb_avx(ZEXT116(6),7,1);
  auVar6 = vpinsrb_avx(auVar6,7,2);
  auVar6 = vpinsrb_avx(auVar6,8,3);
  auVar6 = vpinsrb_avx(auVar6,8,4);
  auVar6 = vpinsrb_avx(auVar6,9,5);
  auVar6 = vpinsrb_avx(auVar6,9,6);
  auVar6 = vpinsrb_avx(auVar6,10,7);
  auVar6 = vpinsrb_avx(auVar6,10,8);
  auVar6 = vpinsrb_avx(auVar6,0xb,9);
  auVar6 = vpinsrb_avx(auVar6,0xb,10);
  auVar6 = vpinsrb_avx(auVar6,0xc,0xb);
  auVar6 = vpinsrb_avx(auVar6,0xc,0xc);
  auVar6 = vpinsrb_avx(auVar6,0xd,0xd);
  auVar6 = vpinsrb_avx(auVar6,0xd,0xe);
  auVar6 = vpinsrb_avx(auVar6,0xe,0xf);
  uStack_90 = auVar6._0_8_;
  uStack_88 = auVar6._8_8_;
  uVar2 = *in_stack_00000008;
  auVar6 = vpinsrw_avx(ZEXT216(uVar2),(uint)uVar2,1);
  auVar6 = vpinsrw_avx(auVar6,(uint)uVar2,2);
  auVar6 = vpinsrw_avx(auVar6,(uint)uVar2,3);
  auVar6 = vpinsrw_avx(auVar6,(uint)uVar2,4);
  auVar6 = vpinsrw_avx(auVar6,(uint)uVar2,5);
  auVar6 = vpinsrw_avx(auVar6,(uint)uVar2,6);
  auVar6 = vpinsrw_avx(auVar6,(uint)uVar2,7);
  auVar9 = vpinsrw_avx(ZEXT216(uVar2),(uint)uVar2,1);
  auVar9 = vpinsrw_avx(auVar9,(uint)uVar2,2);
  auVar9 = vpinsrw_avx(auVar9,(uint)uVar2,3);
  auVar9 = vpinsrw_avx(auVar9,(uint)uVar2,4);
  auVar9 = vpinsrw_avx(auVar9,(uint)uVar2,5);
  auVar9 = vpinsrw_avx(auVar9,(uint)uVar2,6);
  auVar9 = vpinsrw_avx(auVar9,(uint)uVar2,7);
  uStack_250 = auVar9._0_8_;
  uStack_248 = auVar9._8_8_;
  uVar2 = in_stack_00000008[1];
  auVar9 = vpinsrw_avx(ZEXT216(uVar2),(uint)uVar2,1);
  auVar9 = vpinsrw_avx(auVar9,(uint)uVar2,2);
  auVar9 = vpinsrw_avx(auVar9,(uint)uVar2,3);
  auVar9 = vpinsrw_avx(auVar9,(uint)uVar2,4);
  auVar9 = vpinsrw_avx(auVar9,(uint)uVar2,5);
  auVar9 = vpinsrw_avx(auVar9,(uint)uVar2,6);
  auVar9 = vpinsrw_avx(auVar9,(uint)uVar2,7);
  auVar10 = vpinsrw_avx(ZEXT216(uVar2),(uint)uVar2,1);
  auVar10 = vpinsrw_avx(auVar10,(uint)uVar2,2);
  auVar10 = vpinsrw_avx(auVar10,(uint)uVar2,3);
  auVar10 = vpinsrw_avx(auVar10,(uint)uVar2,4);
  auVar10 = vpinsrw_avx(auVar10,(uint)uVar2,5);
  auVar10 = vpinsrw_avx(auVar10,(uint)uVar2,6);
  auVar10 = vpinsrw_avx(auVar10,(uint)uVar2,7);
  uStack_210 = auVar10._0_8_;
  uStack_208 = auVar10._8_8_;
  uVar2 = in_stack_00000008[2];
  auVar10 = vpinsrw_avx(ZEXT216(uVar2),(uint)uVar2,1);
  auVar10 = vpinsrw_avx(auVar10,(uint)uVar2,2);
  auVar10 = vpinsrw_avx(auVar10,(uint)uVar2,3);
  auVar10 = vpinsrw_avx(auVar10,(uint)uVar2,4);
  auVar10 = vpinsrw_avx(auVar10,(uint)uVar2,5);
  auVar10 = vpinsrw_avx(auVar10,(uint)uVar2,6);
  auVar10 = vpinsrw_avx(auVar10,(uint)uVar2,7);
  auVar30 = vpinsrw_avx(ZEXT216(uVar2),(uint)uVar2,1);
  auVar30 = vpinsrw_avx(auVar30,(uint)uVar2,2);
  auVar30 = vpinsrw_avx(auVar30,(uint)uVar2,3);
  auVar30 = vpinsrw_avx(auVar30,(uint)uVar2,4);
  auVar30 = vpinsrw_avx(auVar30,(uint)uVar2,5);
  auVar30 = vpinsrw_avx(auVar30,(uint)uVar2,6);
  auVar30 = vpinsrw_avx(auVar30,(uint)uVar2,7);
  uStack_1d0 = auVar30._0_8_;
  uStack_1c8 = auVar30._8_8_;
  uVar2 = in_stack_00000008[3];
  auVar30 = vpinsrw_avx(ZEXT216(uVar2),(uint)uVar2,1);
  auVar30 = vpinsrw_avx(auVar30,(uint)uVar2,2);
  auVar30 = vpinsrw_avx(auVar30,(uint)uVar2,3);
  auVar30 = vpinsrw_avx(auVar30,(uint)uVar2,4);
  auVar30 = vpinsrw_avx(auVar30,(uint)uVar2,5);
  auVar30 = vpinsrw_avx(auVar30,(uint)uVar2,6);
  auVar30 = vpinsrw_avx(auVar30,(uint)uVar2,7);
  auVar29 = vpinsrw_avx(ZEXT216(uVar2),(uint)uVar2,1);
  auVar29 = vpinsrw_avx(auVar29,(uint)uVar2,2);
  auVar29 = vpinsrw_avx(auVar29,(uint)uVar2,3);
  auVar29 = vpinsrw_avx(auVar29,(uint)uVar2,4);
  auVar29 = vpinsrw_avx(auVar29,(uint)uVar2,5);
  auVar29 = vpinsrw_avx(auVar29,(uint)uVar2,6);
  auVar29 = vpinsrw_avx(auVar29,(uint)uVar2,7);
  auVar29 = ZEXT116(0) * auVar30 + ZEXT116(1) * auVar29;
  auVar30 = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar30;
  uStack_190 = auVar30._0_8_;
  uStack_188 = auVar30._8_8_;
  local_a88 = CONCAT71(in_register_00000039,in_DIL) + -3;
  local_aa4 = in_R9D;
  while( true ) {
    if (local_aa4 == 0) break;
    local_aa8 = 0;
    while( true ) {
      if (in_R8D <= local_aa8) break;
      auVar17 = vpermq_avx2(*(undefined1 (*) [32])(local_a88 + local_aa8),0x94);
      auVar18 = vpermq_avx2(*(undefined1 (*) [32])(local_a88 + 0x10 + (long)local_aa8),0x94);
      auVar11._16_8_ = uStack_150;
      auVar11._0_16_ = auVar7;
      auVar11._24_8_ = uStack_148;
      auVar11 = vpshufb_avx2(auVar17,auVar11);
      auVar12._16_8_ = uStack_110;
      auVar12._0_16_ = auVar3;
      auVar12._24_8_ = uStack_108;
      auVar12 = vpshufb_avx2(auVar17,auVar12);
      auVar13._16_8_ = uStack_d0;
      auVar13._0_16_ = auVar4;
      auVar13._24_8_ = uStack_c8;
      auVar13 = vpshufb_avx2(auVar17,auVar13);
      auVar20._16_8_ = uStack_90;
      auVar20._0_16_ = auVar5;
      auVar20._24_8_ = uStack_88;
      auVar17 = vpshufb_avx2(auVar17,auVar20);
      auVar28._16_8_ = uStack_250;
      auVar28._0_16_ = auVar6;
      auVar28._24_8_ = uStack_248;
      auVar11 = vpmaddubsw_avx2(auVar11,auVar28);
      auVar27._16_8_ = uStack_210;
      auVar27._0_16_ = auVar9;
      auVar27._24_8_ = uStack_208;
      auVar12 = vpmaddubsw_avx2(auVar12,auVar27);
      auVar26._16_8_ = uStack_1d0;
      auVar26._0_16_ = auVar10;
      auVar26._24_8_ = uStack_1c8;
      auVar13 = vpmaddubsw_avx2(auVar13,auVar26);
      auVar25._16_8_ = uStack_190;
      auVar25._0_16_ = auVar29;
      auVar25._24_8_ = uStack_188;
      auVar17 = vpmaddubsw_avx2(auVar17,auVar25);
      auVar14._16_8_ = uStack_150;
      auVar14._0_16_ = auVar7;
      auVar14._24_8_ = uStack_148;
      auVar14 = vpshufb_avx2(auVar18,auVar14);
      auVar15._16_8_ = uStack_110;
      auVar15._0_16_ = auVar3;
      auVar15._24_8_ = uStack_108;
      auVar15 = vpshufb_avx2(auVar18,auVar15);
      auVar16._16_8_ = uStack_d0;
      auVar16._0_16_ = auVar4;
      auVar16._24_8_ = uStack_c8;
      auVar16 = vpshufb_avx2(auVar18,auVar16);
      auVar19._16_8_ = uStack_90;
      auVar19._0_16_ = auVar5;
      auVar19._24_8_ = uStack_88;
      auVar18 = vpshufb_avx2(auVar18,auVar19);
      auVar24._16_8_ = uStack_250;
      auVar24._0_16_ = auVar6;
      auVar24._24_8_ = uStack_248;
      auVar14 = vpmaddubsw_avx2(auVar14,auVar24);
      auVar23._16_8_ = uStack_210;
      auVar23._0_16_ = auVar9;
      auVar23._24_8_ = uStack_208;
      auVar15 = vpmaddubsw_avx2(auVar15,auVar23);
      auVar22._16_8_ = uStack_1d0;
      auVar22._0_16_ = auVar10;
      auVar22._24_8_ = uStack_1c8;
      auVar16 = vpmaddubsw_avx2(auVar16,auVar22);
      auVar21._16_8_ = uStack_190;
      auVar21._0_16_ = auVar29;
      auVar21._24_8_ = uStack_188;
      auVar18 = vpmaddubsw_avx2(auVar18,auVar21);
      auVar11 = vpaddw_avx2(auVar11,auVar12);
      auVar12 = vpaddw_avx2(auVar13,auVar17);
      auVar13 = vpaddw_avx2(auVar14,auVar15);
      auVar17 = vpaddw_avx2(auVar16,auVar18);
      auVar11 = vpaddw_avx2(auVar11,auVar12);
      auVar12 = vpaddw_avx2(auVar13,auVar17);
      auVar18._16_8_ = uStack_290;
      auVar18._0_16_ = auVar8;
      auVar18._24_8_ = uStack_288;
      auVar11 = vpaddw_avx2(auVar11,auVar18);
      auVar17._16_8_ = uStack_290;
      auVar17._0_16_ = auVar8;
      auVar17._24_8_ = uStack_288;
      auVar12 = vpaddw_avx2(auVar12,auVar17);
      auVar11 = vpsraw_avx2(auVar11,ZEXT416(6));
      auVar12 = vpsraw_avx2(auVar12,ZEXT416(6));
      auStack_c30 = auVar11._16_16_;
      auVar30 = vpackuswb_avx(auStack_c30,local_340);
      local_2c0 = auVar30._0_8_;
      uStack_2b8 = auVar30._8_8_;
      *(undefined8 *)(local_a98 + local_aa8) = local_2c0;
      ((undefined8 *)(local_a98 + local_aa8))[1] = uStack_2b8;
      puVar1 = (undefined8 *)(local_a98 + 0x10 + (long)local_aa8);
      auVar30 = vpackuswb_avx(auVar12._0_16_,auVar12._16_16_);
      local_2e0 = auVar30._0_8_;
      uStack_2d8 = auVar30._8_8_;
      *puVar1 = local_2e0;
      puVar1[1] = uStack_2d8;
      local_aa8 = local_aa8 + 0x20;
    }
    local_a88 = local_a88 + in_ESI;
    local_a98 = local_a98 + in_ECX;
    local_aa4 = local_aa4 + -1;
  }
  return;
}

Assistant:

void uavs3d_if_hor_luma_w32x_avx2(const pel *src, int i_src, pel *dst, int i_dst, int width, int height, const s8 *coeff, int max_val)
{
    int col;
    const int offset = 32;
    const int shift = 6;
    __m256i mAddOffset = _mm256_set1_epi16(offset);
    __m256i mSwitch1 = _mm256_setr_epi8(0, 1, 1, 2, 2, 3, 3, 4, 4, 5, 5, 6, 6, 7, 7, 8, 0, 1, 1, 2, 2, 3, 3, 4, 4, 5, 5, 6, 6, 7, 7, 8);
    __m256i mSwitch2 = _mm256_setr_epi8(2, 3, 3, 4, 4, 5, 5, 6, 6, 7, 7, 8, 8, 9, 9, 10, 2, 3, 3, 4, 4, 5, 5, 6, 6, 7, 7, 8, 8, 9, 9, 10);
    __m256i mSwitch3 = _mm256_setr_epi8(4, 5, 5, 6, 6, 7, 7, 8, 8, 9, 9, 10, 10, 11, 11, 12, 4, 5, 5, 6, 6, 7, 7, 8, 8, 9, 9, 10, 10, 11, 11, 12);
    __m256i mSwitch4 = _mm256_setr_epi8(6, 7, 7, 8, 8, 9, 9, 10, 10, 11, 11, 12, 12, 13, 13, 14, 6, 7, 7, 8, 8, 9, 9, 10, 10, 11, 11, 12, 12, 13, 13, 14);
    __m256i T0, T1, S0, S1, S2, S3, sum0, sum1, T2, T3;
    __m256i r0, r1, r2, r3;
    __m256i mCoefy1_hor = _mm256_set1_epi16(*(s16*)coeff);
    __m256i mCoefy2_hor = _mm256_set1_epi16(*(s16*)(coeff + 2));
    __m256i mCoefy3_hor = _mm256_set1_epi16(*(s16*)(coeff + 4));
    __m256i mCoefy4_hor = _mm256_set1_epi16(*(s16*)(coeff + 6));

    src -= 3;

    while (height--) {
        uavs3d_prefetch(src + i_src, _MM_HINT_NTA);
        for (col = 0; col < width; col += 32)
        {
            S0 = _mm256_loadu_si256((__m256i*)(src + col));
            S1 = _mm256_loadu_si256((__m256i*)(src + col + 16));
            S2 = _mm256_permute4x64_epi64(S0, 0x94);
            S3 = _mm256_permute4x64_epi64(S1, 0x94);

            r0 = _mm256_shuffle_epi8(S2, mSwitch1);
            r1 = _mm256_shuffle_epi8(S2, mSwitch2);
            r2 = _mm256_shuffle_epi8(S2, mSwitch3);
            r3 = _mm256_shuffle_epi8(S2, mSwitch4);

            T0 = _mm256_maddubs_epi16(r0, mCoefy1_hor);
            T1 = _mm256_maddubs_epi16(r1, mCoefy2_hor);
            T2 = _mm256_maddubs_epi16(r2, mCoefy3_hor);
            T3 = _mm256_maddubs_epi16(r3, mCoefy4_hor);

            r0 = _mm256_shuffle_epi8(S3, mSwitch1);
            r1 = _mm256_shuffle_epi8(S3, mSwitch2);
            r2 = _mm256_shuffle_epi8(S3, mSwitch3);
            r3 = _mm256_shuffle_epi8(S3, mSwitch4);

            r0 = _mm256_maddubs_epi16(r0, mCoefy1_hor);
            r1 = _mm256_maddubs_epi16(r1, mCoefy2_hor);
            r2 = _mm256_maddubs_epi16(r2, mCoefy3_hor);
            r3 = _mm256_maddubs_epi16(r3, mCoefy4_hor);

            T0 = _mm256_add_epi16(T0, T1);
            T1 = _mm256_add_epi16(T2, T3);
            r0 = _mm256_add_epi16(r0, r1);
            r1 = _mm256_add_epi16(r2, r3);
            sum0 = _mm256_add_epi16(T0, T1);
            sum1 = _mm256_add_epi16(r0, r1);

            sum0 = _mm256_add_epi16(sum0, mAddOffset);
            sum1 = _mm256_add_epi16(sum1, mAddOffset);
            sum0 = _mm256_srai_epi16(sum0, shift); 
            sum1 = _mm256_srai_epi16(sum1, shift);

            _mm_storeu_si128((__m128i*)(dst + col), _mm_packus_epi16(_mm256_castsi256_si128(sum0), _mm256_extracti128_si256(sum0, 1)));
            _mm_storeu_si128((__m128i*)(dst + col + 16), _mm_packus_epi16(_mm256_castsi256_si128(sum1), _mm256_extracti128_si256(sum1, 1)));
        }
        src += i_src;
        dst += i_dst;
    }
}